

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O2

string * __thiscall
flatbuffers::TypedFloatConstantGenerator::Value
          (string *__return_storage_ptr__,TypedFloatConstantGenerator *this,double v,string *src)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
  return __return_storage_ptr__;
}

Assistant:

std::string TypedFloatConstantGenerator::Value(double v,
                                               const std::string &src) const {
  (void)v;
  return src;
}